

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateEqualsCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  JavaType java_type;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  JVar2 = GetJavaType(this->descriptor_);
  if (JVar2 == JAVATYPE_BYTES) {
    io::Printer::Print(printer,&this->variables_,
                       "if (!java.util.Arrays.equals(this.$name$, other.$name$)");
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "\n    || (java.util.Arrays.equals(this.$name$, $default$)\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
                        );
    }
    io::Printer::Print(printer,") {\n  return false;\n}\n");
  }
  else if ((JVar2 == JAVATYPE_STRING) ||
          (bVar1 = Params::use_reference_types_for_primitives((this->super_FieldGenerator).params_),
          bVar1)) {
    io::Printer::Print(printer,&this->variables_,
                       "if (this.$name$ == null) {\n  if (other.$name$ != null) {\n    return false;\n  }\n} else if (!this.$name$.equals(other.$name$)"
                      );
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "\n    || (this.$name$.equals($default$)\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
                        );
    }
    io::Printer::Print(printer,") {\n  return false;\n}\n");
  }
  else if (JVar2 == JAVATYPE_FLOAT) {
    io::Printer::Print(printer,&this->variables_,
                       "{\n  int bits = java.lang.Float.floatToIntBits(this.$name$);\n  if (bits != java.lang.Float.floatToIntBits(other.$name$)"
                      );
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "\n      || (bits == java.lang.Float.floatToIntBits($default$)\n          && this.has$capitalized_name$ != other.has$capitalized_name$)"
                        );
    }
    io::Printer::Print(printer,") {\n    return false;\n  }\n}\n");
  }
  else if (JVar2 == JAVATYPE_DOUBLE) {
    io::Printer::Print(printer,&this->variables_,
                       "{\n  long bits = java.lang.Double.doubleToLongBits(this.$name$);\n  if (bits != java.lang.Double.doubleToLongBits(other.$name$)"
                      );
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "\n      || (bits == java.lang.Double.doubleToLongBits($default$)\n          && this.has$capitalized_name$ != other.has$capitalized_name$)"
                        );
    }
    io::Printer::Print(printer,") {\n    return false;\n  }\n}\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,"if (this.$name$ != other.$name$");
    bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "\n    || (this.$name$ == $default$\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
                        );
    }
    io::Printer::Print(printer,") {\n  return false;\n}\n");
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateEqualsCode(io::Printer* printer) const {
  // We define equality as serialized form equality. If generate_has(),
  // then if the field value equals the default value in both messages,
  // but one's 'has' field is set and the other's is not, the serialized
  // forms are different and we should return false.
  JavaType java_type = GetJavaType(descriptor_);
  if (java_type == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "if (!java.util.Arrays.equals(this.$name$, other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (java.util.Arrays.equals(this.$name$, $default$)\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  } else if (java_type == JAVATYPE_STRING
      || params_.use_reference_types_for_primitives()) {
    printer->Print(variables_,
      "if (this.$name$ == null) {\n"
      "  if (other.$name$ != null) {\n"
      "    return false;\n"
      "  }\n"
      "} else if (!this.$name$.equals(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (this.$name$.equals($default$)\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  } else if (java_type == JAVATYPE_FLOAT) {
    printer->Print(variables_,
      "{\n"
      "  int bits = java.lang.Float.floatToIntBits(this.$name$);\n"
      "  if (bits != java.lang.Float.floatToIntBits(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "      || (bits == java.lang.Float.floatToIntBits($default$)\n"
        "          && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  } else if (java_type == JAVATYPE_DOUBLE) {
    printer->Print(variables_,
      "{\n"
      "  long bits = java.lang.Double.doubleToLongBits(this.$name$);\n"
      "  if (bits != java.lang.Double.doubleToLongBits(other.$name$)");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "      || (bits == java.lang.Double.doubleToLongBits($default$)\n"
        "          && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (this.$name$ != other.$name$");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (this.$name$ == $default$\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  }
}